

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int alloc_addbyter(int output,FILE *data)

{
  char *pcVar1;
  void *pvVar2;
  
  if (*(void **)data == (void *)0x0) {
    pvVar2 = (*Curl_cmalloc)(0x20);
    *(void **)data = pvVar2;
    if (pvVar2 == (void *)0x0) {
      *(undefined4 *)&data->_IO_read_base = 1;
      return -1;
    }
    data->_IO_read_end = (char *)0x20;
    data->_IO_read_ptr = (char *)0x0;
  }
  else {
    pcVar1 = data->_IO_read_end;
    if (pcVar1 <= data->_IO_read_ptr + 1) {
      if ((long)pcVar1 < 1) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = (*Curl_crealloc)(*(void **)data,(size_t)((long)pcVar1 * 2));
      }
      if (pvVar2 == (void *)0x0) {
        *(undefined4 *)&data->_IO_read_base = 1;
        return -1;
      }
      *(void **)data = pvVar2;
      data->_IO_read_end = (char *)((long)pcVar1 * 2);
    }
  }
  data->_IO_read_ptr[*(long *)data] = (char)output;
  data->_IO_read_ptr = data->_IO_read_ptr + 1;
  return output & 0xff;
}

Assistant:

static int alloc_addbyter(int output, FILE *data)
{
  struct asprintf *infop = (struct asprintf *)data;
  unsigned char outc = (unsigned char)output;

  if(!infop->buffer) {
    infop->buffer = malloc(32);
    if(!infop->buffer) {
      infop->fail = 1;
      return -1; /* fail */
    }
    infop->alloc = 32;
    infop->len = 0;
  }
  else if(infop->len + 1 >= infop->alloc) {
    char *newptr = NULL;
    size_t newsize = infop->alloc*2;

    /* detect wrap-around or other overflow problems */
    if(newsize > infop->alloc)
      newptr = realloc(infop->buffer, newsize);

    if(!newptr) {
      infop->fail = 1;
      return -1; /* fail */
    }
    infop->buffer = newptr;
    infop->alloc = newsize;
  }

  infop->buffer[ infop->len ] = outc;

  infop->len++;

  return outc; /* fputc() returns like this on success */
}